

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O2

void __thiscall
BCL::
Array<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
::Array(Array<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>_>
        *this,uint64_t host,size_t size)

{
  Container<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>,_void>
  *pCVar1;
  runtime_error *this_00;
  int i;
  ulong uVar2;
  GlobalPtr<BCL::Container<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>,_void>_>
  GVar3;
  
  this->my_size = size;
  this->my_host = host;
  (this->data).rank = 0;
  (this->data).ptr = 0;
  if (my_rank == host) {
    GVar3 = local_malloc<BCL::Container<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>,BCL::serialize<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>,0ul,void>,void>>
                      (size);
    this->data = GVar3;
    if (GVar3.rank == 0 && GVar3.ptr == 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"BCL: Array does not have enough memory");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pCVar1 = GlobalPtr<BCL::Container<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_BCL::serialize<BCL::HashMapEntry<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_BCL::serialize<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0UL,_void>,_BCL::serialize<int,_0UL,_void>_>,_0UL,_void>,_void>_>
             ::local(&this->data);
    for (uVar2 = 0; uVar2 < this->my_size; uVar2 = uVar2 + 1) {
      (pCVar1->val).key.len = 0;
      (pCVar1->val).val = 0;
      (pCVar1->val).used = 0;
      (pCVar1->val).key.ptr.rank = 0;
      (pCVar1->val).key.ptr.ptr = 0;
      pCVar1 = pCVar1 + 1;
    }
    host = this->my_host;
  }
  GVar3 = broadcast<BCL::GlobalPtr<BCL::Container<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>,BCL::serialize<BCL::HashMapEntry<std::__cxx11::string,int,BCL::serialize<std::__cxx11::string,0ul,void>,BCL::serialize<int,0ul,void>>,0ul,void>,void>>>
                    (&this->data,host);
  this->data = GVar3;
  return;
}

Assistant:

Array(uint64_t host, size_t size) : my_host(host), my_size(size) {
      if (BCL::rank() == this->host()) {
        data = BCL::alloc <CT> (this->size());
        if (data == nullptr) {
          throw std::runtime_error("BCL: Array does not have enough memory");
        }
        CT* ldata = data.local();
        for (int i = 0; i < this->size(); i++) {
          new(&ldata[i]) CT ();
        }
      }
      data = BCL::broadcast(data, this->host());
    }